

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<char,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  byte *__value;
  char buffer [12];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_40;
  byte abStack_2d [13];
  
  local_40._M_stream = it->_M_stream;
  local_40._M_string = it->_M_string;
  iVar1 = *(int *)(this + 4);
  lVar5 = (long)iVar1;
  __value = abStack_2d;
  pbVar3 = abStack_2d + lVar5;
  uVar4 = *(uint *)this;
  do {
    *pbVar3 = (byte)uVar4 & 7 | 0x30;
    pbVar3 = pbVar3 + -1;
    bVar2 = 7 < uVar4;
    uVar4 = uVar4 >> 3;
  } while (bVar2);
  if (0 < iVar1) {
    do {
      __value = __value + 1;
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                (&local_40,(char *)__value);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  it->_M_stream = local_40._M_stream;
  it->_M_string = local_40._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }